

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_init(void)

{
  avl_init(&_naddr_tree,avl_comp_netaddr,0);
  _neigh_list.prev = &_neigh_list;
  _neigh_list.next = &_neigh_list;
  avl_init(&_neigh_originator_tree,avl_comp_netaddr,0);
  _link_list.prev = &_link_list;
  _link_list.next = &_link_list;
  oonf_class_add(&_neigh_info);
  oonf_class_add(&_naddr_info);
  oonf_class_add(&_link_info);
  oonf_class_add(&_laddr_info);
  oonf_class_add(&_l2hop_info);
  oonf_timer_add(&_naddr_vtime_info);
  oonf_timer_add(&_link_vtime_info);
  oonf_timer_add(&_link_heard_info);
  oonf_timer_add(&_link_symtime_info);
  oonf_timer_add(&_l2hop_vtime_info);
  return;
}

Assistant:

void
nhdp_db_init(void) {
  avl_init(&_naddr_tree, avl_comp_netaddr, false);
  list_init_head(&_neigh_list);
  avl_init(&_neigh_originator_tree, avl_comp_netaddr, false);
  list_init_head(&_link_list);

  oonf_class_add(&_neigh_info);
  oonf_class_add(&_naddr_info);
  oonf_class_add(&_link_info);
  oonf_class_add(&_laddr_info);
  oonf_class_add(&_l2hop_info);

  oonf_timer_add(&_naddr_vtime_info);
  oonf_timer_add(&_link_vtime_info);
  oonf_timer_add(&_link_heard_info);
  oonf_timer_add(&_link_symtime_info);
  oonf_timer_add(&_l2hop_vtime_info);
}